

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtStridingMeshInterfaceData * __thiscall
cbtCollisionWorldImporter::createStridingMeshInterfaceData
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterfaceData *interfaceData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  cbtMeshPartData *pcVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  cbtStridingMeshInterfaceData *pcVar8;
  ulong uVar9;
  cbtMeshPartData *pcVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  cbtShortIntIndexData **ppcVar17;
  int local_40;
  cbtStridingMeshInterfaceData *newData;
  
  pcVar8 = (cbtStridingMeshInterfaceData *)::operator_new(0x20);
  uVar7 = *(undefined8 *)((interfaceData->m_scaling).m_floats + 2);
  *(undefined8 *)(pcVar8->m_scaling).m_floats = *(undefined8 *)(interfaceData->m_scaling).m_floats;
  *(undefined8 *)((pcVar8->m_scaling).m_floats + 2) = uVar7;
  iVar1 = interfaceData->m_numMeshParts;
  pcVar8->m_numMeshParts = iVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)iVar1;
  uVar9 = SUB168(auVar6 * ZEXT816(0x38),0);
  if (SUB168(auVar6 * ZEXT816(0x38),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  newData = pcVar8;
  pcVar10 = (cbtMeshPartData *)operator_new__(uVar9);
  pcVar8->m_meshPartsPtr = pcVar10;
  lVar12 = 0x28;
  lVar16 = 0;
  do {
    if (iVar1 <= lVar16) {
      cbtAlignedObjectArray<cbtStridingMeshInterfaceData_*>::push_back
                (&this->m_allocatedcbtStridingMeshInterfaceDatas,&newData);
      return newData;
    }
    pcVar4 = interfaceData->m_meshPartsPtr;
    iVar2 = *(int *)((long)&pcVar4->m_vertices3d + lVar12);
    lVar13 = (long)iVar2;
    *(int *)((long)&pcVar10->m_vertices3d + lVar12) = iVar2;
    iVar3 = *(int *)((long)&pcVar4->m_vertices3d + lVar12 + 4);
    *(int *)((long)&pcVar10->m_vertices3d + lVar12 + 4) = iVar3;
    if (*(long *)((long)pcVar4 + lVar12 + -0x28) == 0) {
      *(undefined8 *)((long)pcVar10 + lVar12 + -0x28) = 0;
    }
    else {
      sVar15 = (long)iVar3 << 4;
      sVar14 = sVar15;
      if (iVar3 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pcVar10 + lVar12 + -0x28) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pcVar4 + lVar12 + -0x28),sVar15);
    }
    if (*(long *)((long)pcVar4 + lVar12 + -0x20) == 0) {
      *(undefined8 *)((long)pcVar10 + lVar12 + -0x20) = 0;
    }
    else {
      sVar15 = (long)iVar3 << 5;
      sVar14 = sVar15;
      if (iVar3 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pcVar10 + lVar12 + -0x20) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pcVar4 + lVar12 + -0x20),sVar15);
    }
    lVar5 = *(long *)((long)pcVar4 + lVar12 + -0x18);
    local_40 = iVar2 * 3;
    if (lVar5 == 0) {
      *(undefined8 *)((long)pcVar10 + lVar12 + -0x18) = 0;
    }
    else {
      sVar14 = lVar13 * 0xc;
      if (iVar2 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pcVar10 + lVar12 + -0x18) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pcVar4 + lVar12 + -0x18),lVar13 * 0xc);
    }
    if (*(long *)((long)pcVar4 + lVar12 + -0x10) == 0) {
      *(undefined8 *)((long)pcVar10 + lVar12 + -0x10) = 0;
      if (*(long *)((long)&pcVar4->m_vertices3f + lVar12) != 0) {
        ppcVar17 = &pcVar4[lVar16].m_indices16;
        goto LAB_00de7082;
      }
      *(undefined8 *)((long)&pcVar10->m_vertices3f + lVar12) = 0;
      if ((lVar5 != 0) || (*(long *)((long)pcVar4 + lVar12 + -8) == 0)) goto LAB_00de70cb;
      sVar14 = lVar13 << 2;
      if (iVar2 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pcVar10 + lVar12 + -8) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pcVar4 + lVar12 + -8),lVar13 << 2);
    }
    else {
      sVar14 = lVar13 * 8;
      if (iVar2 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pcVar10 + lVar12 + -0x10) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pcVar4 + lVar12 + -0x10),lVar13 * 8);
      if (*(long *)((long)&pcVar4->m_vertices3f + lVar12) == 0) {
        *(undefined8 *)((long)&pcVar10->m_vertices3f + lVar12) = 0;
      }
      else {
        ppcVar17 = (cbtShortIntIndexData **)((long)&pcVar4->m_vertices3f + lVar12);
LAB_00de7082:
        sVar14 = (long)local_40 << 2;
        if (iVar2 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar11 = operator_new__(sVar14);
        *(void **)((long)&pcVar10->m_vertices3f + lVar12) = pvVar11;
        memcpy(pvVar11,*ppcVar17,(long)local_40 << 2);
      }
LAB_00de70cb:
      *(undefined8 *)((long)pcVar10 + lVar12 + -8) = 0;
    }
    lVar16 = lVar16 + 1;
    lVar12 = lVar12 + 0x38;
  } while( true );
}

Assistant:

cbtStridingMeshInterfaceData* cbtCollisionWorldImporter::createStridingMeshInterfaceData(cbtStridingMeshInterfaceData* interfaceData)
{
	//create a new cbtStridingMeshInterfaceData that is an exact copy of shapedata and store it in the WorldImporter
	cbtStridingMeshInterfaceData* newData = new cbtStridingMeshInterfaceData;

	newData->m_scaling = interfaceData->m_scaling;
	newData->m_numMeshParts = interfaceData->m_numMeshParts;
	newData->m_meshPartsPtr = new cbtMeshPartData[newData->m_numMeshParts];

	for (int i = 0; i < newData->m_numMeshParts; i++)
	{
		cbtMeshPartData* curPart = &interfaceData->m_meshPartsPtr[i];
		cbtMeshPartData* curNewPart = &newData->m_meshPartsPtr[i];

		curNewPart->m_numTriangles = curPart->m_numTriangles;
		curNewPart->m_numVertices = curPart->m_numVertices;

		if (curPart->m_vertices3f)
		{
			curNewPart->m_vertices3f = new cbtVector3FloatData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3f, curPart->m_vertices3f, sizeof(cbtVector3FloatData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3f = NULL;

		if (curPart->m_vertices3d)
		{
			curNewPart->m_vertices3d = new cbtVector3DoubleData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3d, curPart->m_vertices3d, sizeof(cbtVector3DoubleData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3d = NULL;

		int numIndices = curNewPart->m_numTriangles * 3;
		///the m_3indices8 was not initialized in some Bullet versions, this can cause crashes at loading time
		///we catch it by only dealing with m_3indices8 if none of the other indices are initialized
		bool uninitialized3indices8Workaround = false;

		if (curPart->m_indices32)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_indices32 = new cbtIntIndexData[numIndices];
			memcpy(curNewPart->m_indices32, curPart->m_indices32, sizeof(cbtIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices32 = NULL;

		if (curPart->m_3indices16)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_3indices16 = new cbtShortIntIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices16, curPart->m_3indices16, sizeof(cbtShortIntIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices16 = NULL;

		if (curPart->m_indices16)
		{
			uninitialized3indices8Workaround = true;
			curNewPart->m_indices16 = new cbtShortIntIndexData[numIndices];
			memcpy(curNewPart->m_indices16, curPart->m_indices16, sizeof(cbtShortIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices16 = NULL;

		if (!uninitialized3indices8Workaround && curPart->m_3indices8)
		{
			curNewPart->m_3indices8 = new cbtCharIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices8, curPart->m_3indices8, sizeof(cbtCharIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices8 = NULL;
	}

	m_allocatedcbtStridingMeshInterfaceDatas.push_back(newData);

	return (newData);
}